

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O2

void VP8YuvToArgb32_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst)

{
  uint8_t *puVar1;
  char cVar2;
  undefined1 auVar8 [14];
  undefined1 auVar9 [12];
  unkbyte10 Var10;
  uint3 uVar11;
  unkbyte9 Var12;
  uint5 uVar13;
  undefined1 auVar14 [12];
  undefined1 auVar15 [14];
  ulong uVar16;
  undefined2 uVar17;
  undefined1 auVar24 [16];
  undefined1 auVar28 [16];
  __m128i B;
  __m128i G;
  __m128i R;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  undefined4 uVar18;
  undefined6 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [12];
  undefined1 auVar22 [14];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  for (uVar16 = 0; uVar16 < 0x20; uVar16 = uVar16 + 8) {
    YUV444ToRGB_SSE2(y + uVar16,u + uVar16,v + uVar16,(__m128i *)&local_48,(__m128i *)&local_58,
                     (__m128i *)&local_68);
    cVar2 = (0 < local_58) * (local_58 < 0x100) * (char)local_58 - (0xff < local_58);
    uVar17 = CONCAT11(cVar2,0xff);
    cVar3 = (0 < sStack_56) * (sStack_56 < 0x100) * (char)sStack_56 - (0xff < sStack_56);
    uVar11 = CONCAT12(cVar3,uVar17);
    cVar4 = (0 < sStack_54) * (sStack_54 < 0x100) * (char)sStack_54 - (0xff < sStack_54);
    uVar18 = CONCAT13(cVar4,uVar11);
    cVar5 = (0 < sStack_52) * (sStack_52 < 0x100) * (char)sStack_52 - (0xff < sStack_52);
    uVar13 = CONCAT14(cVar5,uVar18);
    auVar14._5_7_ = 0;
    auVar14._0_5_ = uVar13;
    cVar6 = (0 < sStack_50) * (sStack_50 < 0x100) * (char)sStack_50 - (0xff < sStack_50);
    uVar19 = CONCAT15(cVar6,uVar13);
    cVar7 = (0 < sStack_4e) * (sStack_4e < 0x100) * (char)sStack_4e - (0xff < sStack_4e);
    auVar15[6] = cVar7;
    auVar15._0_6_ = uVar19;
    auVar15._7_7_ = 0;
    auVar31[0xe] = 0xff;
    auVar31._0_14_ = auVar15 << 0x38;
    auVar31[0xf] = (0 < sStack_3a) * (sStack_3a < 0x100) * (char)sStack_3a - (0xff < sStack_3a);
    auVar30._13_3_ =
         (undefined3)
         (CONCAT27(auVar31._14_2_,
                   CONCAT16((0 < sStack_3c) * (sStack_3c < 0x100) * (char)sStack_3c -
                            (0xff < sStack_3c),uVar19)) >> 0x30);
    auVar30[0xc] = 0xff;
    auVar30._0_12_ = auVar14 << 0x38;
    auVar29._11_5_ =
         (undefined5)
         (CONCAT45(auVar30._12_4_,
                   CONCAT14((0 < sStack_3e) * (sStack_3e < 0x100) * (char)sStack_3e -
                            (0xff < sStack_3e),uVar18)) >> 0x20);
    auVar29[10] = 0xff;
    auVar29._0_10_ = (unkuint10)uVar11 << 0x38;
    Var12 = CONCAT72((int7)(CONCAT63(auVar29._10_6_,
                                     CONCAT12((0 < sStack_40) * (sStack_40 < 0x100) *
                                              (char)sStack_40 - (0xff < sStack_40),uVar17)) >> 0x10)
                     ,0xffff);
    Var10 = CONCAT91(CONCAT81((long)((unkuint9)Var12 >> 8),
                              (0 < sStack_42) * (sStack_42 < 0x100) * (char)sStack_42 -
                              (0xff < sStack_42)),0xff);
    auVar9._2_10_ = Var10;
    auVar9[1] = (0 < sStack_44) * (sStack_44 < 0x100) * (char)sStack_44 - (0xff < sStack_44);
    auVar9[0] = 0xff;
    auVar8._2_12_ = auVar9;
    auVar8[1] = (0 < sStack_46) * (sStack_46 < 0x100) * (char)sStack_46 - (0xff < sStack_46);
    auVar8[0] = 0xff;
    auVar28._0_2_ =
         CONCAT11((0 < local_48) * (local_48 < 0x100) * (char)local_48 - (0xff < local_48),0xff);
    auVar28._2_14_ = auVar8;
    uVar17 = CONCAT11((0 < local_68) * (local_68 < 0x100) * (char)local_68 - (0xff < local_68),cVar2
                     );
    uVar18 = CONCAT13((0 < sStack_66) * (sStack_66 < 0x100) * (char)sStack_66 - (0xff < sStack_66),
                      CONCAT12(cVar3,uVar17));
    uVar19 = CONCAT15((0 < sStack_64) * (sStack_64 < 0x100) * (char)sStack_64 - (0xff < sStack_64),
                      CONCAT14(cVar4,uVar18));
    uVar20 = CONCAT17((0 < sStack_62) * (sStack_62 < 0x100) * (char)sStack_62 - (0xff < sStack_62),
                      CONCAT16(cVar5,uVar19));
    auVar21._0_10_ =
         CONCAT19((0 < sStack_60) * (sStack_60 < 0x100) * (char)sStack_60 - (0xff < sStack_60),
                  CONCAT18(cVar6,uVar20));
    auVar21[10] = cVar7;
    auVar21[0xb] = (0 < sStack_5e) * (sStack_5e < 0x100) * (char)sStack_5e - (0xff < sStack_5e);
    auVar22[0xc] = (0 < sStack_4c) * (sStack_4c < 0x100) * (char)sStack_4c - (0xff < sStack_4c);
    auVar22._0_12_ = auVar21;
    auVar22[0xd] = (0 < sStack_5c) * (sStack_5c < 0x100) * (char)sStack_5c - (0xff < sStack_5c);
    auVar23[0xe] = (0 < sStack_4a) * (sStack_4a < 0x100) * (char)sStack_4a - (0xff < sStack_4a);
    auVar23._0_14_ = auVar22;
    auVar23[0xf] = (0 < sStack_5a) * (sStack_5a < 0x100) * (char)sStack_5a - (0xff < sStack_5a);
    auVar27._0_12_ = auVar28._0_12_;
    auVar27._12_2_ = (short)Var10;
    auVar27._14_2_ = (short)((ulong)uVar20 >> 0x30);
    auVar26._12_4_ = auVar27._12_4_;
    auVar26._0_10_ = auVar28._0_10_;
    auVar26._10_2_ = (short)((uint6)uVar19 >> 0x20);
    auVar25._10_6_ = auVar26._10_6_;
    auVar25._0_8_ = auVar28._0_8_;
    auVar25._8_2_ = auVar9._0_2_;
    auVar24._8_8_ = auVar25._8_8_;
    auVar24._6_2_ = (short)((uint)uVar18 >> 0x10);
    auVar24._4_2_ = auVar8._0_2_;
    auVar24._2_2_ = uVar17;
    auVar24._0_2_ = auVar28._0_2_;
    *(undefined1 (*) [16])(dst + uVar16 * 4) = auVar24;
    puVar1 = dst + uVar16 * 4 + 0x10;
    *(short *)puVar1 = (short)((unkuint9)Var12 >> 8);
    *(short *)(puVar1 + 2) = (short)((unkuint10)auVar21._0_10_ >> 0x40);
    *(short *)(puVar1 + 4) = auVar29._10_2_;
    *(short *)(puVar1 + 6) = auVar21._10_2_;
    *(short *)(puVar1 + 8) = auVar30._12_2_;
    *(short *)(puVar1 + 10) = auVar22._12_2_;
    *(short *)(puVar1 + 0xc) = auVar31._14_2_;
    *(short *)(puVar1 + 0xe) = auVar23._14_2_;
  }
  return;
}

Assistant:

void VP8YuvToArgb32_SSE2(const uint8_t* WEBP_RESTRICT y,
                         const uint8_t* WEBP_RESTRICT u,
                         const uint8_t* WEBP_RESTRICT v,
                         uint8_t* WEBP_RESTRICT dst) {
  const __m128i kAlpha = _mm_set1_epi16(255);
  int n;
  for (n = 0; n < 32; n += 8, dst += 32) {
    __m128i R, G, B;
    YUV444ToRGB_SSE2(y + n, u + n, v + n, &R, &G, &B);
    PackAndStore4_SSE2(&kAlpha, &R, &G, &B, dst);
  }
}